

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi2notes.cpp
# Opt level: O2

void convertMidiFile(MidiFile *midifile,
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *matlab)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  MidiEventList *pMVar6;
  MidiEvent *pMVar7;
  long lVar8;
  byte bVar9;
  double dVar10;
  allocator_type local_81;
  vector<double,_std::allocator<double>_> event;
  vector<int,_std::allocator<int>_> onvelocities;
  vector<double,_std::allocator<double>_> ontimes;
  
  smf::MidiFile::absoluteTicks(midifile);
  smf::MidiFile::joinTracks(midifile);
  std::vector<double,_std::allocator<double>_>::vector(&event,8,(allocator_type *)&ontimes);
  std::vector<double,_std::allocator<double>_>::vector
            (&ontimes,0x80,(allocator_type *)&onvelocities);
  std::vector<int,_std::allocator<int>_>::vector(&onvelocities,0x80,&local_81);
  for (lVar8 = 0; lVar8 != 0x80; lVar8 = lVar8 + 1) {
    ontimes.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar8] = -1.0;
    onvelocities.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar8] = -1;
  }
  if (verboseQ != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"-1\ttpq\t");
    iVar2 = smf::MidiFile::getTicksPerQuarterNote(midifile);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  iVar2 = 0;
  do {
    iVar3 = smf::MidiFile::getNumEvents(midifile,0);
    if (iVar3 <= iVar2) {
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&onvelocities.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&ontimes.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&event.super__Vector_base<double,_std::allocator<double>_>);
      return;
    }
    if (verboseQ != 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,">>> ");
      pMVar6 = smf::MidiFile::operator[](midifile,0);
      pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
      poVar5 = (ostream *)
               std::ostream::operator<<
                         (poVar5,(uint)*(pMVar7->super_MidiMessage).
                                        super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
      std::operator<<(poVar5,"\n");
    }
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&event,(long)event.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)event.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3,&unused);
    pMVar6 = smf::MidiFile::operator[](midifile,0);
    pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
    bVar9 = *(pMVar7->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>
             .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pMVar6 = smf::MidiFile::operator[](midifile,0);
    pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
    bVar1 = *(pMVar7->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>
             .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pMVar6 = smf::MidiFile::operator[](midifile,0);
    pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
    if (*(pMVar7->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start == 0xff) {
      pMVar6 = smf::MidiFile::operator[](midifile,0);
      pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
      if ((pMVar7->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[1] == 'Q') {
        setTempo(midifile,iVar2,&tempo);
        if (verboseQ != 0) {
          std::operator<<((ostream *)&std::cout,"# New Tempo: ");
          poVar5 = std::ostream::_M_insert<double>(tempo);
          std::operator<<(poVar5,"\n");
        }
      }
    }
    pMVar6 = smf::MidiFile::operator[](midifile,0);
    pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
    if ((*(pMVar7->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start & 0xf) != 9) {
      if (bVar9 < 0xf0) {
        bVar9 = bVar9 & 0xf0;
      }
      else {
        pMVar6 = smf::MidiFile::operator[](midifile,0);
        pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
        bVar9 = *(pMVar7->super_MidiMessage).
                 super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      if (bVar9 == 0x80) {
LAB_001146ff:
        pMVar6 = smf::MidiFile::operator[](midifile,0);
        pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
        bVar9 = (pMVar7->super_MidiMessage).
                super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start[1];
        pMVar6 = smf::MidiFile::operator[](midifile,0);
        pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
        dVar10 = tempo;
        iVar3 = pMVar7->tick;
        iVar4 = smf::MidiFile::getTicksPerQuarterNote(midifile);
        dVar10 = getTime(iVar3,dVar10,iVar4);
        legend_opcode.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[1] = 1;
        if (verboseQ == 0) {
          *event.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
           ._M_start = ontimes.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[bVar9];
          event.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[1] = 1000.0;
          event.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[2] = dVar10 - ontimes.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                 .super__Vector_impl_data._M_start[bVar9];
          event.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[3] = (double)bVar9;
          event.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[4] = (double)onvelocities.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[bVar9];
          pMVar6 = smf::MidiFile::operator[](midifile,0);
          pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
          event.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[5] = (double)(*(pMVar7->super_MidiMessage).
                                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start & 0xf);
          pMVar6 = smf::MidiFile::operator[](midifile,0);
          pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
          event.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[6] = (double)pMVar7->track;
          event.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[7] = (double)(bVar1 & 0xf);
        }
        else {
          poVar5 = std::ostream::_M_insert<double>
                             (ontimes.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[bVar9]);
          poVar5 = std::operator<<(poVar5,"\tnote");
          std::operator<<(poVar5,"\tdur=");
          poVar5 = std::ostream::_M_insert<double>
                             (dVar10 - ontimes.super__Vector_base<double,_std::allocator<double>_>.
                                       _M_impl.super__Vector_impl_data._M_start[bVar9]);
          poVar5 = std::operator<<(poVar5,"\tpch=");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,(uint)bVar9);
          poVar5 = std::operator<<(poVar5,"\tvel=");
          poVar5 = (ostream *)
                   std::ostream::operator<<
                             (poVar5,onvelocities.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start[bVar9]);
          poVar5 = std::operator<<(poVar5,"\tch=");
          pMVar6 = smf::MidiFile::operator[](midifile,0);
          pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
          poVar5 = (ostream *)
                   std::ostream::operator<<
                             (poVar5,*(pMVar7->super_MidiMessage).
                                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start & 0xf);
          poVar5 = std::operator<<(poVar5,"\ttrack=");
          pMVar6 = smf::MidiFile::operator[](midifile,0);
          pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,pMVar7->track);
          std::endl<char,std::char_traits<char>>(poVar5);
        }
      }
      else if (bVar9 == 0xff) {
        if (verboseQ == 0) {
          pMVar6 = smf::MidiFile::operator[](midifile,0);
          pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
          dVar10 = tempo;
          iVar3 = pMVar7->tick;
          iVar4 = smf::MidiFile::getTicksPerQuarterNote(midifile);
          dVar10 = getTime(iVar3,dVar10,iVar4);
          *event.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
           ._M_start = dVar10;
        }
        else {
          pMVar6 = smf::MidiFile::operator[](midifile,0);
          pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
          dVar10 = tempo;
          iVar3 = pMVar7->tick;
          iVar4 = smf::MidiFile::getTicksPerQuarterNote(midifile);
          dVar10 = getTime(iVar3,dVar10,iVar4);
          poVar5 = std::ostream::_M_insert<double>(dVar10);
          std::operator<<(poVar5,"\t");
        }
        processMetaEvent(midifile,iVar2,&event);
        poVar5 = (ostream *)&std::cout;
        if (verboseQ != 0) {
LAB_00114cbd:
          std::operator<<(poVar5,"\n");
        }
      }
      else if (bVar9 == 0xb0) {
        pMVar6 = smf::MidiFile::operator[](midifile,0);
        pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
        legend_controller.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start
        [(pMVar7->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start[1]] = 1;
        legend_opcode.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[2] = 1;
        if (verboseQ != 0) {
          pMVar6 = smf::MidiFile::operator[](midifile,0);
          pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
          dVar10 = tempo;
          iVar3 = pMVar7->tick;
          iVar4 = smf::MidiFile::getTicksPerQuarterNote(midifile);
          dVar10 = getTime(iVar3,dVar10,iVar4);
          poVar5 = std::ostream::_M_insert<double>(dVar10);
          poVar5 = std::operator<<(poVar5,"\tcontrol");
          poVar5 = std::operator<<(poVar5,"\ttype=");
          pMVar6 = smf::MidiFile::operator[](midifile,0);
          pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
          poVar5 = (ostream *)
                   std::ostream::operator<<
                             (poVar5,(uint)(pMVar7->super_MidiMessage).
                                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                           .
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start[1]);
          poVar5 = std::operator<<(poVar5,"\tval=");
          pMVar6 = smf::MidiFile::operator[](midifile,0);
          pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
          poVar5 = (ostream *)
                   std::ostream::operator<<
                             (poVar5,(uint)(pMVar7->super_MidiMessage).
                                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                           .
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start[2]);
          poVar5 = std::operator<<(poVar5,"\tch=");
          pMVar6 = smf::MidiFile::operator[](midifile,0);
          pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
          poVar5 = (ostream *)
                   std::ostream::operator<<
                             (poVar5,*(pMVar7->super_MidiMessage).
                                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start & 0xf);
          poVar5 = std::operator<<(poVar5,"\ttrack=");
          pMVar6 = smf::MidiFile::operator[](midifile,0);
          pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
          goto LAB_00114ba9;
        }
        pMVar6 = smf::MidiFile::operator[](midifile,0);
        pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
        dVar10 = tempo;
        iVar3 = pMVar7->tick;
        iVar4 = smf::MidiFile::getTicksPerQuarterNote(midifile);
        dVar10 = getTime(iVar3,dVar10,iVar4);
        *event.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start = dVar10;
        event.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[1] = 2000.0;
        pMVar6 = smf::MidiFile::operator[](midifile,0);
        pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
        event.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[2] = (double)(pMVar7->super_MidiMessage).
                              super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start[1];
        pMVar6 = smf::MidiFile::operator[](midifile,0);
        pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
        event.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[3] = (double)(pMVar7->super_MidiMessage).
                              super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start[2];
        pMVar6 = smf::MidiFile::operator[](midifile,0);
        pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
        event.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[5] = (double)(*(pMVar7->super_MidiMessage).
                                super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start & 0xf);
        pMVar6 = smf::MidiFile::operator[](midifile,0);
        pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
LAB_00114e77:
        event.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[6] = (double)pMVar7->track;
      }
      else {
        if (bVar9 == 0xc0) {
          pMVar6 = smf::MidiFile::operator[](midifile,0);
          pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
          legend_instr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start[(pMVar7->super_MidiMessage).
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start[1]] = 1;
          legend_opcode.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[3] = 1;
          if (verboseQ == 0) {
            pMVar6 = smf::MidiFile::operator[](midifile,0);
            pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
            dVar10 = tempo;
            iVar3 = pMVar7->tick;
            iVar4 = smf::MidiFile::getTicksPerQuarterNote(midifile);
            dVar10 = getTime(iVar3,dVar10,iVar4);
            *event.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start = dVar10;
            event.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[1] = 3000.0;
            pMVar6 = smf::MidiFile::operator[](midifile,0);
            pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
            event.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[2] =
                 (double)(pMVar7->super_MidiMessage).
                         super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start[1];
            pMVar6 = smf::MidiFile::operator[](midifile,0);
            pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
            event.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[5] =
                 (double)(*(pMVar7->super_MidiMessage).
                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start & 0xf);
            pMVar6 = smf::MidiFile::operator[](midifile,0);
            pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
            goto LAB_00114e77;
          }
          pMVar6 = smf::MidiFile::operator[](midifile,0);
          pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
          dVar10 = tempo;
          iVar3 = pMVar7->tick;
          iVar4 = smf::MidiFile::getTicksPerQuarterNote(midifile);
          dVar10 = getTime(iVar3,dVar10,iVar4);
          poVar5 = std::ostream::_M_insert<double>(dVar10);
          poVar5 = std::operator<<(poVar5,"\tinstr");
          poVar5 = std::operator<<(poVar5,"\tname=");
          pMVar6 = smf::MidiFile::operator[](midifile,0);
          pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
          poVar5 = std::operator<<(poVar5,GMinstrument
                                          [(pMVar7->super_MidiMessage).
                                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                           .
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start[1]]);
          poVar5 = std::operator<<(poVar5,"\tnum=");
          pMVar6 = smf::MidiFile::operator[](midifile,0);
          pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
          poVar5 = (ostream *)
                   std::ostream::operator<<
                             (poVar5,(uint)(pMVar7->super_MidiMessage).
                                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                           .
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start[1]);
          poVar5 = std::operator<<(poVar5,"\tch=");
          pMVar6 = smf::MidiFile::operator[](midifile,0);
          pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
          poVar5 = (ostream *)
                   std::ostream::operator<<
                             (poVar5,*(pMVar7->super_MidiMessage).
                                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start & 0xf);
          poVar5 = std::operator<<(poVar5,"\ttrack=");
          pMVar6 = smf::MidiFile::operator[](midifile,0);
          pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
LAB_00114ba9:
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,pMVar7->track);
          goto LAB_00114cbd;
        }
        if (bVar9 == 0x90) {
          pMVar6 = smf::MidiFile::operator[](midifile,0);
          pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
          if ((pMVar7->super_MidiMessage).
              super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[2] == '\0') goto LAB_001146ff;
          pMVar6 = smf::MidiFile::operator[](midifile,0);
          pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
          bVar1 = (pMVar7->super_MidiMessage).
                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start[1];
          pMVar6 = smf::MidiFile::operator[](midifile,0);
          pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
          bVar9 = (pMVar7->super_MidiMessage).
                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start[2];
          pMVar6 = smf::MidiFile::operator[](midifile,0);
          pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar2);
          dVar10 = tempo;
          iVar3 = pMVar7->tick;
          iVar4 = smf::MidiFile::getTicksPerQuarterNote(midifile);
          dVar10 = getTime(iVar3,dVar10,iVar4);
          ontimes.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[bVar1] = dVar10;
          onvelocities.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start[bVar1] = (uint)bVar9;
        }
      }
      if ((event.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
           ._M_start[1] != unused) ||
         (NAN(event.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[1]) || NAN(unused))) {
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::push_back(matlab,&event);
      }
    }
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

void convertMidiFile(MidiFile& midifile, vector<vector<double> >& matlab) {
   midifile.absoluteTicks();
   midifile.joinTracks();
   vector<double> event(8);
   vector<double> ontimes(128);
   vector<int> onvelocities(128);
   int i;
   for (i=0; i<128; i++) {
      ontimes[i] = -1.0;
      onvelocities[i] = -1;
   }

   if (verboseQ) {
      cout << "-1\ttpq\t" << midifile.getTicksPerQuarterNote() << endl;
   }

   double offtime = 0.0;
   int key = 0;
   int vel = 0;

   for (i=0; i<midifile.getNumEvents(0); i++) {
      if (verboseQ) {
         cout << ">>> " << (int)midifile[0][i][0] << "\n";
      }
      event.assign(event.size(), unused);
      int command = midifile[0][i][0] & 0xf0;
      int channel = midifile[0][i][0] & 0x0f;

      // check for tempo indication
      if (midifile[0][i][0] == 0xff &&
                 midifile[0][i][1] == 0x51) {
         setTempo(midifile, i, tempo);
         if (verboseQ) {
            cout << "# New Tempo: " << tempo << "\n";
         }
      }

      if ((midifile[0][i][0] & 0x0f) == 0x09) {
          continue;
      }
      if (command == 0xf0) {
         command = midifile[0][i][0];
      }
      if (command == 0x90 && midifile[0][i][2] != 0) {
         // store note-on velocity and time
         key = midifile[0][i][1];
         vel = midifile[0][i][2];
         ontimes[key] = getTime(midifile[0][i].tick, tempo,
            midifile.getTicksPerQuarterNote());

         onvelocities[key] = vel;
      } else if (command == 0x90 || command == 0x80) {
         // note off command write to output
         key = midifile[0][i][1];
         offtime = getTime(midifile[0][i].tick, tempo,
            midifile.getTicksPerQuarterNote());
         legend_opcode[OP_NOTE/1000] = 1;

         if (verboseQ) {
            cout
              << ontimes[key]
              << "\tnote"
              << "\tdur=" << offtime - ontimes[key]
              << "\tpch=" << key
              << "\tvel=" << onvelocities[key]
              << "\tch="  << (midifile[0][i][0] & 0x0f)
              << "\ttrack=" << midifile[0][i].track
              << endl;
         } else {
            event[0] = ontimes[key];
            event[1] = OP_NOTE;
            event[2] = offtime - ontimes[key];
            event[3] = key;
            event[4] = onvelocities[key];
            event[5] = (midifile[0][i][0] & 0x0f);
            event[6] = midifile[0][i].track;
            event[7] = channel;
         }
      } else if (command == 0xb0) {
         legend_controller[midifile[0][i][1]] = 1;
         legend_opcode[OP_CONTROL/1000] = 1;

         if (verboseQ) {
            cout << getTime(midifile[0][i].tick, tempo,
                       midifile.getTicksPerQuarterNote())
                 << "\tcontrol"
                 << "\ttype="  << (int)midifile[0][i][1]
                 << "\tval="   << (int)midifile[0][i][2]
                 << "\tch="    << (midifile[0][i][0] & 0x0f)
                 << "\ttrack=" << midifile[0][i].track
                 << "\n";
         } else {
            event[0] = getTime(midifile[0][i].tick, tempo,
                          midifile.getTicksPerQuarterNote());
            event[1] = OP_CONTROL;
            event[2] = (int)midifile[0][i][1];
            event[3] = (int)midifile[0][i][2];
            event[5] = (midifile[0][i][0] & 0x0f);
            event[6] = midifile[0][i].track;
         }
      } else if (command == 0xc0) {
         legend_instr[midifile[0][i][1]] = 1;
         legend_opcode[OP_INSTR/1000] = 1;

         if (verboseQ) {
         cout << getTime(midifile[0][i].tick, tempo,
                    midifile.getTicksPerQuarterNote())
              << "\tinstr"
              << "\tname="  << GMinstrument[midifile[0][i][1]]
              << "\tnum="   << (int)midifile[0][i][1]
              << "\tch="    << (midifile[0][i][0] & 0x0f)
              << "\ttrack=" << midifile[0][i].track
              << "\n";
         } else {
            event[0] = getTime(midifile[0][i].tick, tempo,
                    midifile.getTicksPerQuarterNote());
            event[1] = OP_INSTR;
            event[2] = (int)midifile[0][i][1];
            event[5] = (midifile[0][i][0] & 0x0f);
            event[6] = midifile[0][i].track;
         }
      } else if (command == 0xff) {
         if (verboseQ) {
            cout << getTime(midifile[0][i].tick, tempo,
                       midifile.getTicksPerQuarterNote())
                 << "\t";
         } else {
            event[0] = getTime(midifile[0][i].tick, tempo,
                       midifile.getTicksPerQuarterNote());
         }
         processMetaEvent(midifile, i, event);
         if (verboseQ) {
            cout << "\n";
         }
      }

      if (event[1] != unused) {
         matlab.push_back(event);
      }
   }
}